

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall foxxll::config::~config(config *this)

{
  bool bVar1;
  pointer pdVar2;
  Logger *pLVar3;
  char *__name;
  Logger local_1a8;
  LoggerVoidify local_29;
  __normal_iterator<foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
  local_28;
  __normal_iterator<foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
  local_20;
  __normal_iterator<const_foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
  local_18;
  const_iterator it;
  config *this_local;
  
  this->_vptr_config = (_func_int **)&PTR__config_001e5620;
  it._M_current = (disk_config *)this;
  local_20._M_current =
       (disk_config *)
       std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::begin
                 (&this->disks_list);
  __gnu_cxx::
  __normal_iterator<foxxll::disk_config_const*,std::vector<foxxll::disk_config,std::allocator<foxxll::disk_config>>>
  ::__normal_iterator<foxxll::disk_config*>
            ((__normal_iterator<foxxll::disk_config_const*,std::vector<foxxll::disk_config,std::allocator<foxxll::disk_config>>>
              *)&local_18,&local_20);
  while( true ) {
    local_28._M_current =
         (disk_config *)
         std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::end
                   (&this->disks_list);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
             ::operator->(&local_18);
    if ((pdVar2->delete_on_exit & 1U) != 0) {
      tlx::Logger::Logger(&local_1a8);
      pLVar3 = tlx::Logger::operator<<(&local_1a8,(char (*) [29])"foxxll: Removing disk file: ");
      pdVar2 = __gnu_cxx::
               __normal_iterator<const_foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
               ::operator->(&local_18);
      pLVar3 = tlx::Logger::operator<<(pLVar3,&pdVar2->path);
      tlx::LoggerVoidify::operator&(&local_29,pLVar3);
      tlx::Logger::~Logger(&local_1a8);
      __gnu_cxx::
      __normal_iterator<const_foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
      ::operator->(&local_18);
      __name = (char *)std::__cxx11::string::c_str();
      unlink(__name);
    }
    __gnu_cxx::
    __normal_iterator<const_foxxll::disk_config_*,_std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>_>
    ::operator++(&local_18,0);
  }
  std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::~vector(&this->disks_list)
  ;
  return;
}

Assistant:

config::~config()
{
    for (disk_list_type::const_iterator it = disks_list.begin();
         it != disks_list.end(); it++)
    {
        if (it->delete_on_exit)
        {
            TLX_LOG1 << "foxxll: Removing disk file: " << it->path;
            unlink(it->path.c_str());
        }
    }
}